

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<const_std::pair<const_int,_double>_*const_&,_const_std::pair<const_int,_double>_*const_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::pair<const_int,_double>_*const_&,_const_std::pair<const_int,_double>_*const_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  string *in_R9;
  StringRef op;
  pair<const_int,_double> *in_stack_ffffffffffffff98;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  StringMaker<std::pair<int_const,double>const*,void>::convert<std::pair<int_const,double>const>
            (in_stack_ffffffffffffff98);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  StringMaker<std::pair<int_const,double>const*,void>::convert<std::pair<int_const,double>const>
            (in_stack_ffffffffffffff98);
  op.m_size = (size_type)local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)local_40,lhs,op,in_R9);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }